

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

EcsTrigger * trigger_find_or_create(ecs_vector_t **triggers,ecs_entity_t entity)

{
  EcsTrigger *pEVar1;
  EcsTrigger *pEVar2;
  uint uVar3;
  void *pvVar4;
  EcsTrigger *pEVar5;
  ulong uVar6;
  long lVar7;
  
  uVar3 = ecs_vector_count(*triggers);
  pvVar4 = _ecs_vector_first(*triggers,0x28,0x10);
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  lVar7 = uVar6 + 1;
  pEVar5 = (EcsTrigger *)((long)pvVar4 + -0x28);
  do {
    lVar7 = lVar7 + -1;
    if (lVar7 == 0) {
      pEVar5 = (EcsTrigger *)_ecs_vector_add(triggers,0x28,0x10);
      return pEVar5;
    }
    pEVar1 = pEVar5 + 1;
    pEVar2 = pEVar5 + 1;
    pEVar5 = pEVar1;
  } while (pEVar2->self != entity);
  return pEVar1;
}

Assistant:

static
EcsTrigger* trigger_find_or_create(
    ecs_vector_t **triggers,
    ecs_entity_t entity)
{
    ecs_vector_each(*triggers, EcsTrigger, trigger, {
        if (trigger->self == entity) {
            return trigger;
        }
    });

    EcsTrigger *result = ecs_vector_add(triggers, EcsTrigger);
    return result;
}